

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMockerBase<void_*(unsigned_long)>::PerformDefaultAction
          (FunctionMockerBase<void_*(unsigned_long)> *this,ArgumentTuple *args,
          string *call_description)

{
  OnCallSpec<void_*(unsigned_long)> *this_00;
  Action<void_*(unsigned_long)> *this_01;
  Result pvVar1;
  Result pvVar2;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<void_*(unsigned_long)> *)0x0) {
    this_01 = OnCallSpec<void_*(unsigned_long)>::GetAction(this_00);
    pvVar1 = Action<void_*(unsigned_long)>::Perform(this_01,args);
    return pvVar1;
  }
  std::operator+(&local_30,call_description,
                 "\n    The mock function has no default action set, and its return type has no default value set."
                );
  if (DefaultValue<void*>::value_ == (undefined8 *)0x0) {
    pvVar2 = (Result)0x0;
  }
  else {
    pvVar2 = (Result)*DefaultValue<void*>::value_;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return pvVar2;
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }